

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

SyscallResult
kj::_::Debug::
syscall<kj::_::expectFatalThrow(kj::Maybe<kj::Exception::Type>,kj::Maybe<kj::StringPtr>,kj::Function<void()>)::__3>
          (anon_class_16_2_faf9cb4d *call,bool nonblocking)

{
  __pid_t _Var1;
  int errorNumber;
  int errorNum;
  bool nonblocking_local;
  anon_class_16_2_faf9cb4d *call_local;
  
  do {
    _Var1 = expectFatalThrow::anon_class_16_2_faf9cb4d::operator()(call);
    if (-1 < _Var1) {
      SyscallResult::SyscallResult((SyscallResult *)((long)&call_local + 4),0);
      return (SyscallResult)call_local._4_4_;
    }
    errorNumber = getOsErrorNumber(nonblocking);
  } while (errorNumber == -1);
  SyscallResult::SyscallResult((SyscallResult *)((long)&call_local + 4),errorNumber);
  return (SyscallResult)call_local._4_4_;
}

Assistant:

Debug::SyscallResult Debug::syscall(Call&& call, bool nonblocking) {
  while (call() < 0) {
    int errorNum = getOsErrorNumber(nonblocking);
    // getOsErrorNumber() returns -1 to indicate EINTR.
    // Also, if nonblocking is true, then it returns 0 on EAGAIN, which will then be treated as a
    // non-error.
    if (errorNum != -1) {
      return SyscallResult(errorNum);
    }
  }
  return SyscallResult(0);
}